

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

CPT * __thiscall despot::TabularCPT::CreateNoisyVariant(TabularCPT *this,double noise)

{
  NamedVar *child;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *p_Var1;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *p_Var2;
  uint uVar3;
  uint uVar4;
  TabularCPT *this_00;
  long lVar5;
  ulong uVar6;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_01;
  ulong uVar7;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_02;
  double extraout_XMM0_Qa;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_48;
  
  uVar3 = (*(this->super_CPT).super_Function._vptr_Function[7])();
  uVar4 = (*(this->super_CPT).super_Function._vptr_Function[9])(this);
  this_00 = (TabularCPT *)operator_new(0x70);
  child = (this->super_CPT).super_Function.child_;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            (&local_48,&(this->super_CPT).super_Function.parents_);
  TabularCPT(this_00,child,&local_48);
  if (local_48.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  p_Var1 = &((this_00->super_CPT).super_Function.map_.
             super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var2 = &((this_00->super_CPT).super_Function.map_.
             super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  this_01 = p_Var1;
  if (p_Var2 != p_Var1) {
    do {
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != p_Var2);
    (this_00->super_CPT).super_Function.map_.
    super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
  }
  this_02 = &(this_00->super_CPT).super_Function.values_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_02,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    lVar5 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this_02->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar5),(long)(int)uVar4);
      lVar5 = lVar5 + 0x18;
    } while ((ulong)uVar3 * 0x18 != lVar5);
  }
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          (*(this->super_CPT).super_Function._vptr_Function[4])
                    (this,uVar6 & 0xffffffff,uVar7 & 0xffffffff);
          *(double *)
           (*(long *)&(this_02->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar6].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + uVar7 * 8) =
               (extraout_XMM0_Qa + noise / (double)(int)uVar4) / (noise + 1.0);
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar3);
  }
  return &this_00->super_CPT;
}

Assistant:

CPT* TabularCPT::CreateNoisyVariant(double noise) const {
	int parent_size = ParentSize(), child_size = ChildSize();

	TabularCPT* cpt = new TabularCPT(child_, parents_);
	cpt->map_.clear();

	cpt->values_.resize(parent_size);
	for (int i = 0; i < parent_size; i++)
		cpt->values_[i].resize(child_size);

	for (int p = 0; p < parent_size; p++) {
		for (int c = 0; c < child_size; c++) {
			cpt->values_[p][c] = (GetValue(p, c) + noise / child_size)
				/ (1 + noise);
		}
	}

	return cpt;
}